

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

size_t __thiscall Server::loadToxFileSize(Server *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  size_type *psVar3;
  size_t sVar4;
  Server *in_RSI;
  ifstream loadFile;
  string local_258;
  string local_238;
  long local_218 [4];
  byte abStack_1f8 [488];
  
  getDataDir_abi_cxx11_(&local_238,in_RSI);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_238);
  paVar1 = &local_258.field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_258.field_2._M_allocated_capacity = *psVar3;
    local_258.field_2._8_8_ = plVar2[3];
    local_258._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar3;
    local_258._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_258._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::ifstream::ifstream(local_218,(string *)&local_258,_S_in|_S_bin);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar1) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  if ((abStack_1f8[*(long *)(local_218[0] + -0x18)] & 5) == 0) {
    std::istream::seekg((long)local_218,_S_beg);
    sVar4 = std::istream::tellg();
    std::ifstream::close();
  }
  else {
    local_258._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_258,"Failed to open tox id file for loading","");
    writeToLog(this,&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != paVar1) {
      operator_delete(local_258._M_dataplus._M_p);
    }
    sVar4 = 0xffffffffffffffff;
  }
  std::ifstream::~ifstream(local_218);
  return sVar4;
}

Assistant:

size_t Server::loadToxFileSize() {
    ifstream loadFile(getDataDir() + "profile_000.tox", ios_base::in | ios_base::binary);

    if (!loadFile) {
        writeToLog("Failed to open tox id file for loading");
        return -1;
    }

    loadFile.seekg(0, ios::end);
    size_t fileSize = loadFile.tellg();

    loadFile.close();

    return fileSize;
}